

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

void Bac_ManCollectGateNameOne
               (Mio_Library_t *pLib,Ptr_ObjType_t Type,word Truth,Vec_Ptr_t *vGateNames)

{
  Mio_Gate_t *pGate;
  char *Entry;
  
  pGate = Mio_LibraryReadGateByTruth(pLib,Truth);
  if (pGate != (Mio_Gate_t *)0x0) {
    Entry = Mio_GateReadName(pGate);
    Vec_PtrWriteEntry(vGateNames,Type,Entry);
    return;
  }
  return;
}

Assistant:

void Bac_ManCollectGateNameOne( Mio_Library_t * pLib, Ptr_ObjType_t Type, word Truth, Vec_Ptr_t * vGateNames )
{
    Mio_Gate_t * pGate = Mio_LibraryReadGateByTruth( pLib, Truth );
    if ( pGate != NULL )
        Vec_PtrWriteEntry( vGateNames, Type, Mio_GateReadName(pGate) );
}